

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O2

void __thiscall snmalloc::MessageBuilder<1024UL>::append(MessageBuilder<1024UL> *this,char *ptr)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  
  do {
    pcVar3 = ptr;
    ptr = "(nullptr)";
  } while (pcVar3 == (char *)0x0);
  while (cVar1 = *pcVar3, cVar1 != '\0') {
    pcVar3 = pcVar3 + 1;
    uVar2 = this->insert;
    if (uVar2 < 0x3ff) {
      this->insert = uVar2 + 1;
      (this->buffer)._M_elems[uVar2] = cVar1;
    }
  }
  return;
}

Assistant:

void append(const char* ptr)
    {
      if (ptr == nullptr)
      {
        append(nullptr);
        return;
      }

      while (char data = *ptr++)
      {
        append_char(data);
      }
    }